

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

bool jsoncons::
     json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::valarray<unsigned_long>,_void>
     ::is(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  byte bVar1;
  bool bVar2;
  iterator this;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> e;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range3;
  bool result;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_30;
  const_array_range_type local_28;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_18;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    (in_stack_ffffffffffffffb8);
  if ((bool)bVar1) {
    local_28 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          CONCAT17(bVar1,in_stack_fffffffffffffff0));
    this = local_28.last_._M_current;
    local_18 = &local_28;
    local_30._M_current =
         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(local_18);
    range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
    ::end(local_18);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)this._M_current,
                         (__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator*(&local_30);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (this._M_current,in_stack_ffffffffffffff98);
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is<unsigned_long>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         0xd1797e);
      if (!bVar2) {
        bVar1 = 0;
      }
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xd179a3);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator++(&local_30);
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static bool is(const Json& j) noexcept
        {
            bool result = j.is_array();
            if (result)
            {
                for (auto e : j.array_range())
                {
                    if (!e.template is<T>())
                    {
                        result = false;
                        break;
                    }
                }
            }
            return result;
        }